

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_unittest.cpp
# Opt level: O2

void __thiscall MyClass::MyClass(MyClass *this)

{
  ostream *poVar1;
  
  this->val_ = -99;
  poVar1 = std::operator<<((ostream *)&std::cerr,"MyClass DEFAULT CONSTRUCTOR: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->val_);
  poVar1 = std::operator<<(poVar1," this: ");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

MyClass () {
        std::cerr << "MyClass DEFAULT CONSTRUCTOR: " << val_ << " this: " << this <<  std::endl;
        //  = default;  TODO: We should not need this
    }